

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O1

void __thiscall FTOutline::convert(FTOutline *this,VPath *path)

{
  short *psVar1;
  VPathData *this_00;
  short sVar2;
  model *pmVar3;
  pointer pEVar4;
  pointer pVVar5;
  SW_FT_Vector *pSVar6;
  size_t segments;
  long lVar7;
  VPointF *cp1;
  pointer pEVar8;
  
  pmVar3 = (path->d).mModel;
  this_00 = &pmVar3->mValue;
  cp1 = (VPointF *)
        ((long)(pmVar3->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(pmVar3->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3);
  segments = VPath::VPathData::segments(this_00);
  grow(this,(size_t)cp1,segments);
  pEVar8 = (pmVar3->mValue).m_elements.
           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar4 = (pmVar3->mValue).m_elements.
           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar8 != pEVar4) {
    lVar7 = 0;
    do {
      switch(*pEVar8) {
      case MoveTo:
        cp1 = (this_00->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7;
        moveTo(this,cp1);
        goto LAB_0011797b;
      case LineTo:
        pVVar5 = (this_00->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar6 = (this->ft).points;
        cp1 = (VPointF *)(long)(this->ft).n_points;
        pSVar6[(long)cp1].x = (long)(pVVar5[lVar7].mx * 64.0);
        pSVar6[(long)cp1].y = (long)(pVVar5[lVar7].my * 64.0);
        (this->ft).tags[(long)cp1] = '\x01';
        psVar1 = &(this->ft).n_points;
        *psVar1 = *psVar1 + 1;
LAB_0011797b:
        lVar7 = lVar7 + 1;
        break;
      case CubicTo:
        pVVar5 = (this_00->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                 super__Vector_impl_data._M_start;
        cp1 = pVVar5 + lVar7;
        cubicTo(this,cp1,pVVar5 + lVar7 + 1,pVVar5[lVar7 + 2]);
        lVar7 = lVar7 + 3;
        break;
      case Close:
        close(this,(int)cp1);
      }
      pEVar8 = pEVar8 + 1;
    } while (pEVar8 != pEVar4);
  }
  sVar2 = (this->ft).n_points;
  if (sVar2 != 0) {
    (this->ft).contours[(this->ft).n_contours] = sVar2 + -1;
    (this->ft).n_contours = (this->ft).n_contours + 1;
  }
  return;
}

Assistant:

void FTOutline::convert(const VPath &path)
{
    const std::vector<VPath::Element> &elements = path.elements();
    const std::vector<VPointF> &       points = path.points();

    grow(points.size(), path.segments());

    size_t index = 0;
    for (auto element : elements) {
        switch (element) {
        case VPath::Element::MoveTo:
            moveTo(points[index]);
            index++;
            break;
        case VPath::Element::LineTo:
            lineTo(points[index]);
            index++;
            break;
        case VPath::Element::CubicTo:
            cubicTo(points[index], points[index + 1], points[index + 2]);
            index = index + 3;
            break;
        case VPath::Element::Close:
            close();
            break;
        }
    }
    end();
}